

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

QPDFObjectHandle __thiscall QPDF::newIndirectNull(QPDF *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<QPDFObject> *in_RSI;
  QPDFObjectHandle QVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002ebaf0;
  *(undefined1 *)&this_00[4]._vptr__Sp_counted_base = 2;
  this_00[4]._M_use_count = 0;
  this_00[4]._M_weak_count = 0;
  this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[5]._M_use_count = 0;
  this_00[5]._M_weak_count = 0;
  this_00[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[6]._M_use_count = -1;
  this_00[6]._M_weak_count = -1;
  QVar2 = makeIndirectFromQPDFObject(this,in_RSI);
  _Var1._M_pi = QVar2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var1._M_pi = extraout_RDX;
  }
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::newIndirectNull()
{
    return makeIndirectFromQPDFObject(QPDFObject::create<QPDF_Null>());
}